

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdtext.c
# Opt level: O0

int cueify_cdtext_deserialize(cueify_cdtext *t,uint8_t *buffer,size_t size)

{
  byte bVar1;
  size_t sVar2;
  ushort uVar3;
  uint uVar4;
  int iVar5;
  uchar *puVar6;
  char *pcVar7;
  size_t sVar8;
  void *pvVar9;
  long lVar10;
  char *local_890;
  char *data_ptr;
  char *data;
  char **datum;
  cdtext_descriptor *descriptor;
  size_t pack_size;
  size_t pack_sizes [8] [16];
  uchar *pack;
  uchar *pack_data [8] [16];
  uint local_4c;
  int local_48;
  int track;
  int pack_type;
  int block;
  uint8_t *bp;
  uint16_t toc_length;
  cueify_cdtext_private *cdtext;
  size_t size_local;
  uint8_t *buffer_local;
  cueify_cdtext *t_local;
  
  if ((t == (cueify_cdtext *)0x0) || (buffer == (uint8_t *)0x0)) {
    t_local._4_4_ = 3;
  }
  else if (size < 4) {
    t_local._4_4_ = 6;
  }
  else {
    uVar3 = CONCAT11(*buffer,buffer[1]);
    if (size - 2 < (ulong)uVar3) {
      t_local._4_4_ = 6;
    }
    else if ((int)(uVar3 - 2) % 0x12 == 0) {
      for (track = 0; track < 8; track = track + 1) {
        for (local_48 = 0; local_48 < 0x10; local_48 = local_48 + 1) {
          pack_data[(long)track + -1][(long)local_48 + 0xf] = (uchar *)0x0;
          pack_sizes[(long)track + -1][(long)local_48 + 0xf] = 0;
        }
      }
      for (local_4c = 0; (int)local_4c < 100; local_4c = local_4c + 1) {
        for (track = 0; track < 8; track = track + 1) {
          free(t[(long)track * 0x325 + (long)(int)local_4c + 2]);
          t[(long)track * 0x325 + (long)(int)local_4c + 2] = (cueify_cdtext)0x0;
          free(t[(long)track * 0x325 + (long)(int)local_4c + 0x66]);
          t[(long)track * 0x325 + (long)(int)local_4c + 0x66] = (cueify_cdtext)0x0;
          free(t[(long)track * 0x325 + (long)(int)local_4c + 0xca]);
          t[(long)track * 0x325 + (long)(int)local_4c + 0xca] = (cueify_cdtext)0x0;
          free(t[(long)track * 0x325 + (long)(int)local_4c + 0x12e]);
          t[(long)track * 0x325 + (long)(int)local_4c + 0x12e] = (cueify_cdtext)0x0;
          free(t[(long)track * 0x325 + (long)(int)local_4c + 0x192]);
          t[(long)track * 0x325 + (long)(int)local_4c + 0x192] = (cueify_cdtext)0x0;
          free(t[(long)track * 0x325 + (long)(int)local_4c + 0x1f6]);
          t[(long)track * 0x325 + (long)(int)local_4c + 0x1f6] = (cueify_cdtext)0x0;
          free(t[(long)track * 0x325 + (long)(int)local_4c + 0x25a]);
          t[(long)track * 0x325 + (long)(int)local_4c + 0x25a] = (cueify_cdtext)0x0;
          free(t[(long)track * 0x325 + (long)(int)local_4c + 0x2be]);
          t[(long)track * 0x325 + (long)(int)local_4c + 0x2be] = (cueify_cdtext)0x0;
          if (t[(long)track * 0x325 + 0x322] != (cueify_cdtext)0x0) {
            free(t[(long)track * 0x325 + 0x322]);
            t[(long)track * 0x325 + 0x322] = (cueify_cdtext)0x0;
          }
          if (t[(long)track * 0x325 + 0x324] != (cueify_cdtext)0x0) {
            free(t[(long)track * 0x325 + 0x324]);
            t[(long)track * 0x325 + 0x324] = (cueify_cdtext)0x0;
          }
        }
        free(t[(long)(int)local_4c + 0x195b]);
        t[(long)(int)local_4c + 0x195b] = (cueify_cdtext)0x0;
        *(undefined1 *)((long)t + (long)(int)local_4c + 0xca6e) = 0;
      }
      for (_pack_type = buffer + 4; _pack_type < buffer + (int)(uVar3 - 2);
          _pack_type = _pack_type + 0x12) {
        if ((((int)(uint)_pack_type[1] >> 7 == 0) && (0x7f < *_pack_type)) && (*_pack_type < 0x90))
        {
          lVar10 = (long)(int)((int)(uint)_pack_type[3] >> 4 & 7);
          pack_sizes[lVar10 + -1][(long)(int)(*_pack_type - 0x80) + 0xf] =
               pack_sizes[lVar10 + -1][(long)(int)(*_pack_type - 0x80) + 0xf] + 0xc;
        }
      }
      for (track = 0; track < 8; track = track + 1) {
        for (local_48 = 0; local_48 < 0x10; local_48 = local_48 + 1) {
          if (pack_sizes[(long)track + -1][(long)local_48 + 0xf] != 0) {
            puVar6 = (uchar *)malloc(pack_sizes[(long)track + -1][(long)local_48 + 0xf]);
            pack_data[(long)track + -1][(long)local_48 + 0xf] = puVar6;
            if (pack_data[(long)track + -1][(long)local_48 + 0xf] == (uchar *)0x0)
            goto LAB_00151420;
            pack_sizes[(long)track + -1][(long)local_48 + 0xf] = 0;
          }
        }
      }
      for (_pack_type = buffer + 4; _pack_type < buffer + (int)(uVar3 - 2);
          _pack_type = _pack_type + 0x12) {
        if ((((int)(uint)_pack_type[1] >> 7 == 0) && (0x7f < *_pack_type)) && (*_pack_type < 0x90))
        {
          uVar4 = (int)(uint)_pack_type[3] >> 4 & 7;
          iVar5 = *_pack_type - 0x80;
          puVar6 = pack_data[(long)(int)uVar4 + -1][(long)iVar5 + 0xf];
          sVar2 = pack_sizes[(long)(int)uVar4 + -1][(long)iVar5 + 0xf];
          *(undefined8 *)(puVar6 + sVar2) = *(undefined8 *)(_pack_type + 4);
          *(undefined4 *)(puVar6 + sVar2 + 8) = *(undefined4 *)(_pack_type + 0xc);
          pack_sizes[(long)(int)uVar4 + -1][(long)iVar5 + 0xf] =
               pack_sizes[(long)(int)uVar4 + -1][(long)iVar5 + 0xf] + 0xc;
        }
      }
      for (track = 0; track < 8; track = track + 1) {
        if (pack_sizes[track][0xe] == 0x24) {
          *(undefined4 *)(t + (long)track * 0x325) = 1;
          *(uchar *)((long)t + (long)track * 0x1928 + 4) = *pack_data[track][0xe];
          *(uchar *)((long)t + (long)track * 0x1928 + 5) = pack_data[track][0xe][track + 0x1c];
          *(uchar *)((long)t + (long)track * 0x1928 + 6) = pack_data[track][0xe][1];
          *(uchar *)((long)t + (long)track * 0x1928 + 7) = pack_data[track][0xe][2];
          *(char *)(t + (long)track * 0x325 + 1) = (char)((int)(uint)pack_data[track][0xe][3] >> 7);
          *(byte *)((long)t + (long)track * 0x1928 + 9) =
               (byte)((int)(uint)pack_data[track][0xe][3] >> 6) & 1;
          *(byte *)((long)t + (long)track * 0x1928 + 10) =
               (byte)((int)(uint)pack_data[track][0xe][3] >> 2) & 1;
          *(byte *)((long)t + (long)track * 0x1928 + 0xb) =
               (byte)((int)(uint)pack_data[track][0xe][3] >> 1) & 1;
          *(byte *)((long)t + (long)track * 0x1928 + 0xc) = pack_data[track][0xe][3] & 1;
        }
      }
      for (track = 0; track < 8; track = track + 1) {
        for (local_48 = 0; local_48 < 0x10; local_48 = local_48 + 1) {
          if (pack_sizes[(long)track + -1][(long)local_48 + 0xf] != 0) {
            switch(local_48) {
            case 0:
            case 1:
            case 2:
            case 3:
            case 4:
            case 5:
            case 0xd:
            case 0xe:
              data_ptr = (char *)0x0;
              bVar1 = *(byte *)((long)t + (long)track * 0x1928 + 4);
              if (bVar1 < 2) {
                data_ptr = latin1_to_utf8(pack_data[(long)track + -1][(long)local_48 + 0xf],
                                          (int)pack_sizes[(long)track + -1][(long)local_48 + 0xf]);
joined_r0x00150b8f:
                if (data_ptr == (char *)0x0) goto LAB_00151420;
              }
              else if (bVar1 == 0x80) {
                data_ptr = msjis_to_utf8(pack_data[(long)track + -1][(long)local_48 + 0xf],
                                         (int)(pack_sizes[(long)track + -1][(long)local_48 + 0xf] >>
                                              1));
                goto joined_r0x00150b8f;
              }
              switch(local_48) {
              case 0:
                data = (char *)(t + (long)track * 0x325 + 2);
                break;
              case 1:
                data = (char *)(t + (long)track * 0x325 + 0x66);
                break;
              case 2:
                data = (char *)(t + (long)track * 0x325 + 0xca);
                break;
              case 3:
                data = (char *)(t + (long)track * 0x325 + 0x12e);
                break;
              case 4:
                data = (char *)(t + (long)track * 0x325 + 0x192);
                break;
              case 5:
                data = (char *)(t + (long)track * 0x325 + 0x1f6);
                break;
              default:
                break;
              case 0xd:
                data = (char *)(t + (long)track * 0x325 + 0x25a);
                break;
              case 0xe:
                data = (char *)(t + (long)track * 0x325 + 0x2be);
              }
              if (data_ptr != (char *)0x0) {
                local_890 = data_ptr;
                pcVar7 = strdup(data_ptr);
                *(char **)data = pcVar7;
                if (*(long *)data == 0) goto LAB_00151420;
                for (local_4c = (uint)*(byte *)((long)t + (long)track * 0x1928 + 6);
                    (int)local_4c <= (int)(uint)*(byte *)((long)t + (long)track * 0x1928 + 7);
                    local_4c = local_4c + 1) {
                  sVar8 = strlen(local_890);
                  local_890 = local_890 + sVar8 + 1;
                  pcVar7 = strdup(local_890);
                  *(char **)(data + (long)(int)local_4c * 8) = pcVar7;
                  if (*(long *)(data + (long)(int)local_4c * 8) == 0) goto LAB_00151420;
                }
                free(data_ptr);
              }
              break;
            case 6:
              pcVar7 = latin1_to_utf8(pack_data[(long)track + -1][(long)local_48 + 0xf],
                                      (int)pack_sizes[(long)track + -1][(long)local_48 + 0xf]);
              t[(long)track * 0x325 + 0x322] = pcVar7;
              break;
            case 7:
              *(ushort *)(t + (long)track * 0x325 + 0x323) =
                   CONCAT11(*pack_data[(long)track + -1][(long)local_48 + 0xf],
                            pack_data[(long)track + -1][(long)local_48 + 0xf][1]);
              pcVar7 = latin1_to_utf8(pack_data[(long)track + -1][(long)local_48 + 0xf] + 2,
                                      (int)pack_sizes[(long)track + -1][(long)local_48 + 0xf] + -2);
              t[(long)track * 0x325 + 0x324] = pcVar7;
              break;
            case 8:
              *(uchar *)(t + 0x1928) = *pack_data[(long)track + -1][(long)local_48 + 0xf];
              *(uchar *)((long)t + 0xc941) = pack_data[(long)track + -1][(long)local_48 + 0xf][1];
              *(uchar *)((long)t + 0xc942) = pack_data[(long)track + -1][(long)local_48 + 0xf][3];
              *(uchar *)((long)t + 0xc943) = pack_data[(long)track + -1][(long)local_48 + 0xf][4];
              *(uchar *)((long)t + 0xc944) = pack_data[(long)track + -1][(long)local_48 + 0xf][5];
              for (local_4c = (uint)*(byte *)(t + 0x1928);
                  (int)local_4c <= (int)(uint)*(byte *)((long)t + 0xc941); local_4c = local_4c + 1)
              {
                *(uchar *)((long)t + (long)(int)local_4c * 3 + 0xc942) =
                     pack_data[(long)track + -1][(long)local_48 + 0xf]
                     [(int)((local_4c - *(byte *)(t + 0x1928)) * 3 + 0xc)];
                *(uchar *)((long)t + (long)(int)local_4c * 3 + 0xc943) =
                     pack_data[(long)track + -1][(long)local_48 + 0xf]
                     [(int)((local_4c - *(byte *)(t + 0x1928)) * 3 + 0xd)];
                *(uchar *)((long)t + (long)(int)local_4c * 3 + 0xc944) =
                     pack_data[(long)track + -1][(long)local_48 + 0xf]
                     [(int)((local_4c - *(byte *)(t + 0x1928)) * 3 + 0xe)];
              }
              break;
            case 9:
            case 0xf:
            default:
            }
          }
        }
      }
      for (_pack_type = buffer + 4; _pack_type < buffer + (int)(uVar3 - 2);
          _pack_type = _pack_type + 0x12) {
        if ((((int)(uint)_pack_type[1] >> 7 == 0) && (0x7f < *_pack_type)) &&
           ((*_pack_type < 0x90 && (*_pack_type == 0x89)))) {
          uVar4 = _pack_type[1] & 0x7f;
          *(byte *)((long)t + (long)(int)uVar4 + 0xca6e) = _pack_type[5];
          if (t[(long)(int)uVar4 + 0x195b] == (cueify_cdtext)0x0) {
            pvVar9 = malloc((ulong)*(byte *)((long)t + (long)(int)uVar4 + 0xca6e) * 6);
            t[(long)(int)uVar4 + 0x195b] = pvVar9;
            if (t[(long)(int)uVar4 + 0x195b] == (cueify_cdtext)0x0) {
LAB_00151420:
              for (track = 0; track < 8; track = track + 1) {
                for (local_48 = 0; local_48 < 0x10; local_48 = local_48 + 1) {
                  free(pack_data[(long)track + -1][(long)local_48 + 0xf]);
                }
              }
              return 4;
            }
          }
          *(byte *)((long)t[(long)(int)uVar4 + 0x195b] + (long)(int)(_pack_type[4] - 1) * 6) =
               _pack_type[10];
          *(byte *)((long)t[(long)(int)uVar4 + 0x195b] + (long)(int)(_pack_type[4] - 1) * 6 + 1) =
               _pack_type[0xb];
          *(byte *)((long)t[(long)(int)uVar4 + 0x195b] + (long)(int)(_pack_type[4] - 1) * 6 + 2) =
               _pack_type[0xc];
          *(byte *)((long)t[(long)(int)uVar4 + 0x195b] + (long)(int)(_pack_type[4] - 1) * 6 + 3) =
               _pack_type[0xd];
          *(byte *)((long)t[(long)(int)uVar4 + 0x195b] + (long)(int)(_pack_type[4] - 1) * 6 + 4) =
               _pack_type[0xe];
          *(byte *)((long)t[(long)(int)uVar4 + 0x195b] + (long)(int)(_pack_type[4] - 1) * 6 + 5) =
               _pack_type[0xf];
        }
      }
      for (track = 0; track < 8; track = track + 1) {
        for (local_48 = 0; local_48 < 0x10; local_48 = local_48 + 1) {
          free(pack_data[(long)track + -1][(long)local_48 + 0xf]);
        }
      }
      t_local._4_4_ = 0;
    }
    else {
      t_local._4_4_ = 7;
    }
  }
  return t_local._4_4_;
}

Assistant:

int cueify_cdtext_deserialize(cueify_cdtext *t, const uint8_t * const buffer,
			      size_t size) {
    cueify_cdtext_private *cdtext = (cueify_cdtext_private *)t;
    uint16_t toc_length;
    const uint8_t *bp;
    int block, pack_type, track;
    unsigned char *pack_data[MAX_BLOCKS][16];
    unsigned char *pack;
    size_t pack_sizes[MAX_BLOCKS][16];
    size_t pack_size;
    struct cdtext_descriptor *descriptor;

    if (t == NULL || buffer == NULL) {
	return CUEIFY_ERR_BADARG;
    }
    if (size < 4) {
	return CUEIFY_ERR_TRUNCATED;
    }

    /* CD-TEXT Data Length */
    toc_length = ((buffer[0] << 8) | buffer[1]);
    if (size - 2 < toc_length) {
	return CUEIFY_ERR_TRUNCATED;
    }
    if ((toc_length - 2) % 18 != 0) {
	return CUEIFY_ERR_CORRUPTED;
    }

    /* Reserved */

    /* Zero out the pack data. */
    for (block = 0; block < MAX_BLOCKS; block++) {
	for (pack_type = 0; pack_type < 16; pack_type++) {
	    pack_data[block][pack_type] = NULL;
	    pack_sizes[block][pack_type] = 0;
	}
    }

    /* Zero out the cdtext data (so it can be freed) */
    for (track = 0; track < MAX_TRACKS; track++) {
	for (block = 0; block < MAX_BLOCKS; block++) {
	    free(cdtext->blocks[block].titles[track]);
	    cdtext->blocks[block].titles[track] = NULL;
	    free(cdtext->blocks[block].performers[track]);
	    cdtext->blocks[block].performers[track] = NULL;
	    free(cdtext->blocks[block].songwriters[track]);
	    cdtext->blocks[block].songwriters[track] = NULL;
	    free(cdtext->blocks[block].composers[track]);
	    cdtext->blocks[block].composers[track] = NULL;
	    free(cdtext->blocks[block].arrangers[track]);
	    cdtext->blocks[block].arrangers[track] = NULL;
	    free(cdtext->blocks[block].messages[track]);
	    cdtext->blocks[block].messages[track] = NULL;
	    free(cdtext->blocks[block].private[track]);
	    cdtext->blocks[block].private[track] = NULL;
	    free(cdtext->blocks[block].upc_isrcs[track]);
	    cdtext->blocks[block].upc_isrcs[track] = NULL;
	    if (cdtext->blocks[block].discid != NULL) {
		free(cdtext->blocks[block].discid);
		cdtext->blocks[block].discid = NULL;
	    }
	    if (cdtext->blocks[block].genre_name != NULL) {
		free(cdtext->blocks[block].genre_name);
		cdtext->blocks[block].genre_name = NULL;
	    }
	}

	free(cdtext->toc.intervals[track]);
	cdtext->toc.intervals[track] = NULL;
	cdtext->toc.num_intervals[track] = 0;
    }

    /* Count all of the PACKs by BLOCK, so we know how much space to
     * allocate. */
    for (bp = buffer + 4; bp < buffer + (toc_length - 2); bp += 18) {
	descriptor = (struct cdtext_descriptor *)bp;

	/* Ignore extension blocks. */
	if (EXTENSION_FLAG(descriptor->track_number) ||
	    descriptor->pack_type < 0x80 ||
	    descriptor->pack_type > 0x8F) {
	    continue;
	}

	pack_sizes[BLOCK_NUMBER(descriptor->block_number)]
	    [descriptor->pack_type - 0x80] += 12;
    }

    /* Allocate the aggregate PACK space. */
    for (block = 0; block < MAX_BLOCKS; block++) {
	for (pack_type = 0; pack_type < 16; pack_type++) {
	    if (pack_sizes[block][pack_type] > 0) {
		pack_data[block][pack_type] =
		    malloc(pack_sizes[block][pack_type]);
		if (pack_data[block][pack_type] == NULL) {
		    goto error;
		}
		/* Reset the size count, so that we can use it as a pointer. */
		pack_sizes[block][pack_type] = 0;
	    }
	}
    }

    /* Aggregate all PACKs. */
    /* NOTE: We assume that PACKs in a given PACK type are in order!! */
    for (bp = buffer + 4; bp < buffer + (toc_length - 2); bp += 18) {
	descriptor = (struct cdtext_descriptor *)bp;

	/* Ignore extension blocks. */
	if (EXTENSION_FLAG(descriptor->track_number) ||
	    descriptor->pack_type < 0x80 ||
	    descriptor->pack_type > 0x8F) {
	    continue;
	}

	block = BLOCK_NUMBER(descriptor->block_number);
	pack_type = descriptor->pack_type - 0x80;

	pack = pack_data[block][pack_type];
	pack_size = pack_sizes[block][pack_type];
	memcpy(pack + pack_size, descriptor->data, 12);
	pack_sizes[block][pack_type] += 12;
	/* TODO: Check CRC */
    }

    /*
     * Now that we have collected all of the PACKs by BLOCK and type,
     * parse the size information PACKs to get the character code,
     * track, and language code info.
     */
    for (block = 0; block < MAX_BLOCKS; block++) {
	/* Don't know how to handle any other size of the size
	 * information block! */
	if (pack_sizes[block][15] != 36) {
	    continue;
	}

	cdtext->blocks[block].valid = 1;
	cdtext->blocks[block].charset = pack_data[block][15][0];
	/* NOTE: This might not work if the language codes aren't in
	 * EVERY info block */
	cdtext->blocks[block].language = pack_data[block][15][block + 28];
	cdtext->blocks[block].first_track_number = pack_data[block][15][1];
	cdtext->blocks[block].last_track_number = pack_data[block][15][2];
	cdtext->blocks[block].program_cdtext =
	    (pack_data[block][15][3] >> 7) & 1;
	cdtext->blocks[block].program_copyright =
	    (pack_data[block][15][3] >> 6) & 1;
	cdtext->blocks[block].message_copyright =
	    (pack_data[block][15][3] >> 2) & 1;
	cdtext->blocks[block].name_copyright =
	    (pack_data[block][15][3] >> 1) & 1;
	cdtext->blocks[block].title_copyright =
	    (pack_data[block][15][3]) & 1;
    }

    for (block = 0; block < MAX_BLOCKS; block++) {
	for (pack_type = 0; pack_type < 16; pack_type++) {
	    if (pack_sizes[block][pack_type] > 0) {
		char **datum;
		char *data = NULL, *data_ptr = NULL;

		switch (pack_type) {
		case 0:   /* 0x80 = TITLE */
		case 1:   /* 0x81 = PERFORMER */
		case 2:   /* 0x82 = SONGWRITER */
		case 3:   /* 0x83 = COMPOSER */
		case 4:   /* 0x84 = ARRANGER */
		case 5:   /* 0x85 = MESSAGE */
		case 13:  /* 0x8D = PRIVATE */
		case 14:  /* 0x8E = UPC/ISRC */
		    /* Textual track-wise PACKs. */

		    /* Decode the PACK contents. */
		    data = NULL;
		    switch (cdtext->blocks[block].charset) {
		    case CUEIFY_CDTEXT_CHARSET_ASCII:
		    case CUEIFY_CDTEXT_CHARSET_ISO8859_1:
			data = latin1_to_utf8(pack_data[block][pack_type],
					      pack_sizes[block][pack_type]);
			if (data == NULL) {
			    goto error;
			}
			break;
		    case CUEIFY_CDTEXT_CHARSET_MSJIS:
			/* NOTE: MS-JIS is a two-byte encoding. */
			data = msjis_to_utf8(pack_data[block][pack_type],
					     pack_sizes[block][pack_type] / 2);
			if (data == NULL) {
			    goto error;
			}
			break;
		    default:
			/* Ignore! */
			break;
		    }

		    /* Split data by track. */
		    switch (pack_type) {
		    case 0:   /* 0x80 = TITLE */
			datum = cdtext->blocks[block].titles;
			break;
		    case 1:   /* 0x81 = PERFORMER */
			datum = cdtext->blocks[block].performers;
			break;
		    case 2:   /* 0x82 = SONGWRITER */
			datum = cdtext->blocks[block].songwriters;
			break;
		    case 3:   /* 0x83 = COMPOSER */
			datum = cdtext->blocks[block].composers;
			break;
		    case 4:   /* 0x84 = ARRANGER */
			datum = cdtext->blocks[block].arrangers;
			break;
		    case 5:   /* 0x85 = MESSAGE */
			datum = cdtext->blocks[block].messages;
			break;
		    /* NOTE: 0x8D/0x8E probably break in MS-JIS!! */
		    case 13:  /* 0x8D = PRIVATE */
			datum = cdtext->blocks[block].private;
			break;
		    case 14:  /* 0x8E = UPC/ISRC */
			datum = cdtext->blocks[block].upc_isrcs;
			break;
		    default:
			break;
		    }

		    /* Copy the decoded text */
		    /* NOTE: This is probably broken for things which
		     * skip tracks. */
		    if (data != NULL) {
			data_ptr = data;
			/* First do the album-wide value. */
			datum[0] = strdup(data_ptr);
			if (datum[0] == NULL) {
			    /* Failed to strdup */
			    goto error;
			}
			/* NOTE: We assume all tracks are included! */
			for (track = cdtext->blocks[block].first_track_number;
			     track <= cdtext->blocks[block].last_track_number;
			     track++) {
			    /* Skip to next track entry. */
			    data_ptr += strlen(data_ptr) + 1;
			    datum[track] = strdup(data_ptr);
			    if (datum[track] == NULL) {
				/* Failed to strdup */
				goto error;
			    }
			}

			/* All done with the decoded value. We can free it. */
			free(data);
		    }
		    break;
		case 6:   /* 0x86 = DISCID */
		    /* According to Red Book, only ISO 8859-1 may be used. */
		    cdtext->blocks[block].discid =
			latin1_to_utf8(pack_data[block][pack_type],
				       pack_sizes[block][pack_type]);
		    break;
		case 7:   /* 0x87 = GENRE */
		    /* Genre includes a genre code in addition to text. */
		    cdtext->blocks[block].genre_code =
			((uint16_t)pack_data[block][pack_type][0] << 8) |
			((uint16_t)pack_data[block][pack_type][1]);
		    /* No particular reason to believe this is Latin1 only?? */
		    cdtext->blocks[block].genre_name =
			latin1_to_utf8(pack_data[block][pack_type] + 2,
				       pack_sizes[block][pack_type] - 2);
		    break;
		case 8:   /* 0x88 = TOCINFO */
		    /* This basically encodes another (short) TOC. */
		    /* NOTE: We assume that the TOC only occurs once. */
		    cdtext->toc.first_track_number =
			pack_data[block][pack_type][0];
		    cdtext->toc.last_track_number =
			pack_data[block][pack_type][1];
		    cdtext->toc.offsets[0].min =
			pack_data[block][pack_type][3];
		    cdtext->toc.offsets[0].sec =
			pack_data[block][pack_type][4];
		    cdtext->toc.offsets[0].frm =
			pack_data[block][pack_type][5];
		    /* NOTE: We assume that the tracks are contiguous
		     * in increasing order. */
		    for (track = cdtext->toc.first_track_number;
			 track <= cdtext->toc.last_track_number;
			 track++) {
			cdtext->toc.offsets[track].min =
			    pack_data[block][pack_type]
			    [12+(track - cdtext->toc.first_track_number)*3];
			cdtext->toc.offsets[track].sec =
			    pack_data[block][pack_type]
			    [12+(track - cdtext->toc.first_track_number)*3+1];
			cdtext->toc.offsets[track].frm =
			    pack_data[block][pack_type]
			    [12+(track - cdtext->toc.first_track_number)*3+2];
		    }
		    break;
		case 9:   /* 0x89 = TOCINFO2 */
		    /* Need the track number from the PACK, so we
		     * ignore and handle later. */
		case 15:  /* 0x8F = SIZEINFO */
		default:
		    /* Ignore! */
		    break;
		}
	    }
	}
    }

    /* Finally, we go back and do the TOCINFO2 packets. */
    for (bp = buffer + 4; bp < buffer + (toc_length - 2); bp += 18) {
	descriptor = (struct cdtext_descriptor *)bp;

	/* Ignore extension blocks. */
	if (EXTENSION_FLAG(descriptor->track_number) ||
	    descriptor->pack_type < 0x80 ||
	    descriptor->pack_type > 0x8F) {
	    continue;
	}

	block = BLOCK_NUMBER(descriptor->block_number);
	pack_type = descriptor->pack_type;

	/* NOTE: We assume that the TOC-2 only occurs once. */
	if (pack_type == 0x89) {
	    track = TRACK_NUMBER(descriptor->track_number);

	    cdtext->toc.num_intervals[track] = descriptor->data[1];
	    if (cdtext->toc.intervals[track] == NULL) {
		cdtext->toc.intervals[track] =
		    malloc(cdtext->toc.num_intervals[track] *
			   sizeof(cueify_cdtext_toc_track_interval_private));
		if (cdtext->toc.intervals[track] == NULL) {
		    goto error;
		}
	    }

	    cdtext->toc.intervals[track][descriptor->data[0] - 1].start.min =
		descriptor->data[6];
	    cdtext->toc.intervals[track][descriptor->data[0] - 1].start.sec =
		descriptor->data[7];
	    cdtext->toc.intervals[track][descriptor->data[0] - 1].start.frm =
		descriptor->data[8];
	    cdtext->toc.intervals[track][descriptor->data[0] - 1].end.min =
		descriptor->data[9];
	    cdtext->toc.intervals[track][descriptor->data[0] - 1].end.sec =
		descriptor->data[10];
	    cdtext->toc.intervals[track][descriptor->data[0] - 1].end.frm =
		descriptor->data[11];
	}
    }

    for (block = 0; block < MAX_BLOCKS; block++) {
	for (pack_type = 0; pack_type < 16; pack_type++) {
	    free(pack_data[block][pack_type]);
	}
    }

    return CUEIFY_OK;

error:
    for (block = 0; block < MAX_BLOCKS; block++) {
	for (pack_type = 0; pack_type < 16; pack_type++) {
	    free(pack_data[block][pack_type]);
	}
    }

    /* Almost always a memory error. */
    return CUEIFY_ERR_NOMEM;
}